

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void JS_AddIntrinsicMapSet(JSContext *ctx)

{
  JSValue *pJVar1;
  char *in_RCX;
  long lVar2;
  ulong uVar3;
  byte *pbVar4;
  JSValue obj;
  JSValue JVar5;
  JSValue proto;
  char buf [64];
  
  lVar2 = 0;
  for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
    in_RCX = JS_AtomGetStr(ctx,buf,(int)uVar3 + 0xaa,(JSAtom)in_RCX);
    pJVar1 = ctx->class_proto;
    JVar5 = JS_NewObject(ctx);
    *(JSValueUnion *)((long)&pJVar1[0x1f].u + lVar2 * 2) = JVar5.u;
    *(int64_t *)((long)&pJVar1[0x1f].tag + lVar2 * 2) = JVar5.tag;
    obj.tag = *(int64_t *)((long)&ctx->class_proto[0x1f].tag + lVar2 * 2);
    obj.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto[0x1f].u + lVar2 * 2))->ptr;
    JS_SetPropertyFunctionList
              (ctx,obj,*(JSCFunctionListEntry **)((long)js_map_proto_funcs_ptr + lVar2),
               (uint)"\f\v\x05\x04\x02\x02"[uVar3]);
    JVar5 = JS_NewCFunction2(ctx,js_map_constructor,in_RCX,0,JS_CFUNC_constructor_magic,(int)uVar3);
    if (uVar3 < 2) {
      JS_SetPropertyFunctionList(ctx,JVar5,js_map_funcs,1);
    }
    proto.tag = *(int64_t *)((long)&ctx->class_proto[0x1f].tag + lVar2 * 2);
    proto.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto[0x1f].u + lVar2 * 2))->ptr;
    JS_NewGlobalCConstructor2(ctx,JVar5,in_RCX,proto);
    lVar2 = lVar2 + 8;
  }
  pbVar4 = "\x02\x02";
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 8) {
    pJVar1 = ctx->class_proto;
    JVar5 = JS_NewObjectProto(ctx,ctx->iterator_proto);
    *(JSValueUnion *)((long)&pJVar1[0x23].u + lVar2 * 2) = JVar5.u;
    *(int64_t *)((long)&pJVar1[0x23].tag + lVar2 * 2) = JVar5.tag;
    JVar5.tag = *(int64_t *)((long)&ctx->class_proto[0x23].tag + lVar2 * 2);
    JVar5.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto[0x23].u + lVar2 * 2))->ptr;
    JS_SetPropertyFunctionList
              (ctx,JVar5,*(JSCFunctionListEntry **)((long)js_map_proto_funcs_ptr + lVar2 + 0x20),
               (uint)*pbVar4);
    pbVar4 = pbVar4 + 1;
  }
  return;
}

Assistant:

void JS_AddIntrinsicMapSet(JSContext *ctx)
{
    int i;
    JSValue obj1;
    char buf[ATOM_GET_STR_BUF_SIZE];

    for(i = 0; i < 4; i++) {
        const char *name = JS_AtomGetStr(ctx, buf, sizeof(buf),
                                         JS_ATOM_Map + i);
        ctx->class_proto[JS_CLASS_MAP + i] = JS_NewObject(ctx);
        JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_MAP + i],
                                   js_map_proto_funcs_ptr[i],
                                   js_map_proto_funcs_count[i]);
        obj1 = JS_NewCFunctionMagic(ctx, js_map_constructor, name, 0,
                                    JS_CFUNC_constructor_magic, i);
        if (i < 2) {
            JS_SetPropertyFunctionList(ctx, obj1, js_map_funcs,
                                       countof(js_map_funcs));
        }
        JS_NewGlobalCConstructor2(ctx, obj1, name, ctx->class_proto[JS_CLASS_MAP + i]);
    }

    for(i = 0; i < 2; i++) {
        ctx->class_proto[JS_CLASS_MAP_ITERATOR + i] =
            JS_NewObjectProto(ctx, ctx->iterator_proto);
        JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_MAP_ITERATOR + i],
                                   js_map_proto_funcs_ptr[i + 4],
                                   js_map_proto_funcs_count[i + 4]);
    }
}